

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy.c
# Opt level: O1

void mbedtls_entropy_free(mbedtls_entropy_context *ctx)

{
  long lVar1;
  
  lVar1 = 0;
  do {
    *(undefined1 *)((long)(ctx->accumulator).total + lVar1) = 0;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x400);
  return;
}

Assistant:

void mbedtls_entropy_free( mbedtls_entropy_context *ctx )
{
#if defined(MBEDTLS_HAVEGE_C)
    mbedtls_havege_free( &ctx->havege_data );
#endif
#if defined(MBEDTLS_THREADING_C)
    mbedtls_mutex_free( &ctx->mutex );
#endif
    mbedtls_zeroize( ctx, sizeof( mbedtls_entropy_context ) );
}